

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

string * __thiscall
kratos::StmtScopeVisitor::get_front_name_abi_cxx11_
          (string *__return_storage_ptr__,StmtScopeVisitor *this,Var *var)

{
  undefined1 local_68 [8];
  optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mapping;
  
  get_target_var_name_abi_cxx11_
            ((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68,(kratos *)this,var);
  if (mapping.
      super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_payload._56_1_ == '\x01') {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_68);
  }
  else {
    (*(this->super_IRVisitor)._vptr_IRVisitor[0x1f])(__return_storage_ptr__,this);
  }
  std::
  _Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_reset((_Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68);
  return __return_storage_ptr__;
}

Assistant:

static std::string get_front_name(const Var *var) {
        auto mapping = get_target_var_name(var);
        if (mapping) {
            return mapping->first;
        }
        return var->to_string();
    }